

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EmptyMemberSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::EmptyMemberSymbol,slang::SourceLocation>
          (BumpAllocator *this,SourceLocation *args)

{
  EmptyMemberSymbol *pEVar1;
  size_t in_RSI;
  BumpAllocator *in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  
  pEVar1 = (EmptyMemberSymbol *)allocate(in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  slang::ast::EmptyMemberSymbol::EmptyMemberSymbol((EmptyMemberSymbol *)in_RDI,unaff_retaddr);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }